

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_L_upper.c
# Opt level: O0

void test_option_L_upper(void)

{
  wchar_t wVar1;
  
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                   ,L'\r');
    test_skipping("Can\'t test symlinks on this filesystem");
  }
  else {
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                       ,L'\x14',"in",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                    ,L'\x15',"in");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                       ,L'\x16',"d1",L'ǭ');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'\x17',"ld1","d1",L'\x01');
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                        ,L'\x18',"d1/file1",L'Ƥ',L'\xffffffff',"d1/file1");
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                        ,L'\x19',"d1/file2",L'Ƥ',L'\xffffffff',"d1/file2");
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'\x1a',"d1/link1","file1",L'\0');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'\x1b',"d1/linkX","fileX",L'\0');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'\x1c',"link2","d1/file2",L'\0');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'\x1d',"linkY","d1/fileY",L'\0');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                    ,L'\x1e',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                       ,L'!',"test1",L'ǭ');
    wVar1 = systemf("%s -cf test1/archive.tar -C in . >test1/c.out 2>test1/c.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                        ,L'#',0,"0",(long)wVar1,
                        "systemf(\"%s -cf test1/archive.tar -C in . >test1/c.out 2>test1/c.err\", testprog)"
                        ,(void *)0x0);
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                    ,L'$',"test1");
    wVar1 = systemf("%s -xf archive.tar >c.out 2>c.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                        ,L'&',0,"0",(long)wVar1,
                        "systemf(\"%s -xf archive.tar >c.out 2>c.err\", testprog)",(void *)0x0);
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'\'',"ld1","d1",L'\x01');
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'(',"d1/link1","file1",L'\0');
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L')',"d1/linkX","fileX",L'\0');
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'*',"link2","d1/file2",L'\0');
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'+',"linkY","d1/fileY",L'\0');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                    ,L',',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                       ,L'/',"test2",L'ǭ');
    wVar1 = systemf("%s -cf test2/archive.tar -L -C in . >test2/c.out 2>test2/c.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                        ,L'1',0,"0",(long)wVar1,
                        "systemf(\"%s -cf test2/archive.tar -L -C in . >test2/c.out 2>test2/c.err\", testprog)"
                        ,(void *)0x0);
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                    ,L'2',"test2");
    wVar1 = systemf("%s -xf archive.tar >c.out 2>c.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                        ,L'4',0,"0",(long)wVar1,
                        "systemf(\"%s -xf archive.tar >c.out 2>c.err\", testprog)",(void *)0x0);
    wVar1 = umasked(0x1ed);
    assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                     ,L'5',"ld1",wVar1);
    wVar1 = umasked(0x1a4);
    assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                     ,L'6',"d1/link1",wVar1);
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'7',"d1/linkX","fileX",L'\0');
    wVar1 = umasked(0x1a4);
    assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                     ,L'8',"link2",wVar1);
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'9',"linkY","d1/fileY",L'\0');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                    ,L':',"..");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                       ,L'=',"test3",L'ǭ');
    wVar1 = systemf("%s -cf test3/archive.tar -L -C in ld1 d1 link2 linkY >test3/c.out 2>test3/c.err"
                    ,testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                        ,L'?',0,"0",(long)wVar1,
                        "systemf(\"%s -cf test3/archive.tar -L -C in ld1 d1 link2 linkY >test3/c.out 2>test3/c.err\", testprog)"
                        ,(void *)0x0);
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                    ,L'@',"test3");
    wVar1 = systemf("%s -xf archive.tar >c.out 2>c.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                        ,L'B',0,"0",(long)wVar1,
                        "systemf(\"%s -xf archive.tar >c.out 2>c.err\", testprog)",(void *)0x0);
    wVar1 = umasked(0x1ed);
    assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                     ,L'C',"ld1",wVar1);
    wVar1 = umasked(0x1a4);
    assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                     ,L'D',"d1/link1",wVar1);
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'E',"d1/linkX","fileX",L'\0');
    wVar1 = umasked(0x1a4);
    assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                     ,L'F',"link2",wVar1);
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
               ,L'G',"linkY","d1/fileY",L'\0');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_L_upper.c"
                    ,L'H',"..");
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_L_upper)
{

	if (!canSymlink()) {
		skipping("Can't test symlinks on this filesystem");
		return;
	}

	/*
	 * Create a sample archive.
	 */
	assertMakeDir("in", 0755);
	assertChdir("in");
	assertMakeDir("d1", 0755);
	assertMakeSymlink("ld1", "d1", 1);
	assertMakeFile("d1/file1", 0644, "d1/file1");
	assertMakeFile("d1/file2", 0644, "d1/file2");
	assertMakeSymlink("d1/link1", "file1", 0);
	assertMakeSymlink("d1/linkX", "fileX", 0);
	assertMakeSymlink("link2", "d1/file2", 0);
	assertMakeSymlink("linkY", "d1/fileY", 0);
	assertChdir("..");

	/* Test 1: Without -L */
	assertMakeDir("test1", 0755);
	assertEqualInt(0,
	    systemf("%s -cf test1/archive.tar -C in . >test1/c.out 2>test1/c.err", testprog));
	assertChdir("test1");
	assertEqualInt(0,
	    systemf("%s -xf archive.tar >c.out 2>c.err", testprog));
	assertIsSymlink("ld1", "d1", 1);
	assertIsSymlink("d1/link1", "file1", 0);
	assertIsSymlink("d1/linkX", "fileX", 0);
	assertIsSymlink("link2", "d1/file2", 0);
	assertIsSymlink("linkY", "d1/fileY", 0);
	assertChdir("..");

	/* Test 2: With -L, no symlink on command line. */
	assertMakeDir("test2", 0755);
	assertEqualInt(0,
	    systemf("%s -cf test2/archive.tar -L -C in . >test2/c.out 2>test2/c.err", testprog));
	assertChdir("test2");
	assertEqualInt(0,
	    systemf("%s -xf archive.tar >c.out 2>c.err", testprog));
	assertIsDir("ld1", umasked(0755));
	assertIsReg("d1/link1", umasked(0644));
	assertIsSymlink("d1/linkX", "fileX", 0);
	assertIsReg("link2", umasked(0644));
	assertIsSymlink("linkY", "d1/fileY", 0);
	assertChdir("..");

	/* Test 3: With -L, some symlinks on command line. */
	assertMakeDir("test3", 0755);
	assertEqualInt(0,
	    systemf("%s -cf test3/archive.tar -L -C in ld1 d1 link2 linkY >test3/c.out 2>test3/c.err", testprog));
	assertChdir("test3");
	assertEqualInt(0,
	    systemf("%s -xf archive.tar >c.out 2>c.err", testprog));
	assertIsDir("ld1", umasked(0755));
	assertIsReg("d1/link1", umasked(0644));
	assertIsSymlink("d1/linkX", "fileX", 0);
	assertIsReg("link2", umasked(0644));
	assertIsSymlink("linkY", "d1/fileY", 0);
	assertChdir("..");

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Test 4: With -L, using wildcards with some symlinks on command line. (wildcards are supported only in Windows) */
	assertMakeDir("test4", 0755);
	assertEqualInt(0,
	    systemf("%s -cf test4/archive.tar -L -C in * >test4/c.out 2>test4/c.err", testprog));
	assertChdir("test4");
	assertEqualInt(0,
	    systemf("%s -xf archive.tar >c.out 2>c.err", testprog));
	assertIsDir("ld1", umasked(0755));
	assertIsReg("d1/link1", umasked(0644));
	assertIsSymlink("d1/linkX", "fileX", 0);
	assertIsReg("link2", umasked(0644));
	assertIsSymlink("linkY", "d1/fileY", 0);
	assertChdir("..");
#endif
}